

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::GroupNode::set(GroupNode *this,size_t i,Ref<embree::SceneGraph::Node> *node)

{
  reference pvVar1;
  long *in_RDX;
  size_type in_RSI;
  long in_RDI;
  
  pvVar1 = std::
           vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
           ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                         *)(in_RDI + 0x68),in_RSI);
  if (*in_RDX != 0) {
    (**(code **)(*(long *)*in_RDX + 0x10))();
  }
  if (pvVar1->ptr != (Node *)0x0) {
    (*(pvVar1->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pvVar1->ptr = (Node *)*in_RDX;
  return;
}

Assistant:

void set(const size_t i, const Ref<Node>& node) {
        children[i] = node;
      }